

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O2

string * Diligent::LinuxFileSystem::GetCurrentDirectory_abi_cxx11_(void)

{
  char *__ptr;
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  __ptr = getcwd((char *)0x0,0);
  if (__ptr != (char *)0x0) {
    std::__cxx11::string::assign((char *)in_RDI);
    free(__ptr);
  }
  return in_RDI;
}

Assistant:

std::string LinuxFileSystem::GetCurrentDirectory()
{
    std::string CurrDir;
    if (auto* cwd = getcwd(NULL, 0))
    {
        CurrDir = cwd;
        free(cwd);
    }
    return CurrDir;
}